

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void export_keymap_to_file(void)

{
  bool bVar1;
  int __fd;
  uint uVar2;
  int iVar3;
  char *__file;
  int *piVar4;
  undefined8 uVar5;
  ssize_t sVar6;
  uint local_44;
  uint i;
  uint index;
  int buflen;
  char buffer [32];
  int keymap_fd;
  
  __file = (char *)std::__cxx11::string::c_str();
  __fd = open(__file,0xc1,0x1a4);
  if (__fd == -1) {
    piVar4 = __errno_location();
    iVar3 = *piVar4;
    uVar5 = std::__cxx11::string::c_str();
    error(1,iVar3,"Error opening output file \'%s\'",uVar5);
  }
  for (local_44 = 0; local_44 < 0x81; local_44 = local_44 + 1) {
    i = 0;
    bVar1 = is_char_key(local_44);
    if (bVar1) {
      uVar2 = to_char_keys_index(local_44);
      if (((char_keys[uVar2] == L'\0') || (shift_keys[uVar2] == L'\0')) ||
         (altgr_keys[uVar2] == L'\0')) {
        if ((char_keys[uVar2] == L'\0') || (shift_keys[uVar2] == L'\0')) {
          if (char_keys[uVar2] == L'\0') {
            i = sprintf((char *)&index,"\n");
          }
          else {
            i = sprintf((char *)&index,"%lc\n",(ulong)(uint)char_keys[uVar2]);
          }
        }
        else {
          i = sprintf((char *)&index,"%lc %lc\n",(ulong)(uint)char_keys[uVar2],
                      (ulong)(uint)shift_keys[uVar2]);
        }
      }
      else {
        i = sprintf((char *)&index,"%lc %lc %lc\n",(ulong)(uint)char_keys[uVar2],
                    (ulong)(uint)shift_keys[uVar2],(ulong)(uint)altgr_keys[uVar2]);
      }
    }
    else {
      bVar1 = is_func_key(local_44);
      if (bVar1) {
        iVar3 = to_func_keys_index(local_44);
        i = sprintf((char *)&index,"%ls\n",func_keys + iVar3);
      }
    }
    bVar1 = is_used_key(local_44);
    if ((bVar1) && (sVar6 = write(__fd,&index,(long)(int)i), sVar6 < (int)i)) {
      piVar4 = __errno_location();
      iVar3 = *piVar4;
      uVar5 = std::__cxx11::string::c_str();
      error(1,iVar3,"Error writing to keymap file \'%s\'",uVar5);
    }
  }
  close(__fd);
  uVar5 = std::__cxx11::string::c_str();
  error(0,0,"Success writing keymap to file \'%s\'",uVar5);
  exit(0);
}

Assistant:

void export_keymap_to_file()
{
    int keymap_fd = open(args.keymap.c_str(), O_CREAT | O_EXCL | O_WRONLY, 0644);
    if (keymap_fd == -1)
        error(EXIT_FAILURE, errno, "Error opening output file '%s'", args.keymap.c_str());
    char buffer[32];
    int buflen = 0;
    unsigned int index;
    for (unsigned int i = 0; i < sizeof(char_or_func); ++i) {
        buflen = 0;
        if (is_char_key(i)) {
            index = to_char_keys_index(i);
            // only export non-null characters
            if (char_keys[index]  != L'\0' &&
                shift_keys[index] != L'\0' &&
                altgr_keys[index] != L'\0')
                buflen = sprintf(buffer, "%lc %lc %lc\n", char_keys[index], shift_keys[index], altgr_keys[index]);
            else if (char_keys[index]  != L'\0' &&
                     shift_keys[index] != L'\0')
                buflen = sprintf(buffer, "%lc %lc\n", char_keys[index], shift_keys[index]);
            else if (char_keys[index] != L'\0')
                buflen = sprintf(buffer, "%lc\n", char_keys[index]);
            else                                     // if all \0, export nothing on that line (=keymap will not parse)
                buflen = sprintf(buffer, "\n");
        }
        else if (is_func_key(i)) {
            buflen = sprintf(buffer, "%ls\n", func_keys[to_func_keys_index(i)]);
        }

        if (is_used_key(i))
            if (write(keymap_fd, buffer, buflen) < buflen)
                error(EXIT_FAILURE, errno, "Error writing to keymap file '%s'", args.keymap.c_str());
    }
    close(keymap_fd);
    error(EXIT_SUCCESS, 0, "Success writing keymap to file '%s'", args.keymap.c_str());
    exit(EXIT_SUCCESS);
}